

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O2

int __thiscall GGSock::Communicator::listen(Communicator *this,int __fd,int __n)

{
  TSocketDescriptor *sock;
  uchar *puVar1;
  uint __errnum;
  _Head_base<0UL,_GGSock::Communicator::Data_*,_false> this_00;
  FILE *__stream;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  undefined8 in_RAX;
  undefined7 extraout_var;
  uint *puVar5;
  int in_ECX;
  char *pcVar6;
  size_t sStack_40;
  undefined4 uStack_38;
  int enable;
  
  this_00._M_head_impl =
       (this->data_)._M_t.
       super___uniq_ptr_impl<GGSock::Communicator::Data,_std::default_delete<GGSock::Communicator::Data>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::Communicator::Data_*,_std::default_delete<GGSock::Communicator::Data>_>
       .super__Head_base<0UL,_GGSock::Communicator::Data_*,_false>._M_head_impl;
  _uStack_38 = in_RAX;
  std::mutex::lock((mutex *)&((pthread_mutex_t *)&(this_00._M_head_impl)->mutex)->__data);
  if (((this_00._M_head_impl)->isConnected == false) &&
     ((this_00._M_head_impl)->isListening == false)) {
    sock = &(this_00._M_head_impl)->sd;
    anon_unknown.dwarf_7a85::closeAndReset(sock);
    iVar3 = socket(2,1,6);
    *sock = iVar3;
    if (iVar3 < 0) {
      anon_unknown.dwarf_7a85::closeAndReset(sock);
      __stream = _stderr;
      puVar5 = (uint *)__errno_location();
      __errnum = *puVar5;
      pcVar6 = strerror(__errnum);
      iVar3 = 0;
      fprintf(__stream,"Error creating socket (%d %s)\n",(ulong)__errnum,pcVar6);
      goto LAB_0010e74f;
    }
    _uStack_38 = CONCAT44(1,uStack_38);
    iVar3 = setsockopt(iVar3,1,2,&enable,4);
    if (iVar3 < 0) {
      fwrite("setsockopt(SO_REUSEADDR) failed",0x1f,1,_stderr);
    }
    iVar3 = setsockopt(*sock,1,0xf,&enable,4);
    if (iVar3 < 0) {
      fwrite("setsockopt(SO_REUSEPORT) failed",0x1f,1,_stderr);
    }
    puVar1 = (uchar *)((long)&(this_00._M_head_impl)->addr + 8);
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    ((this_00._M_head_impl)->addr).sin_family = 2;
    ((in_addr *)((long)&(this_00._M_head_impl)->addr + 4))->s_addr = 0;
    *(ushort *)((long)&(this_00._M_head_impl)->addr + 2) = (ushort)__fd << 8 | (ushort)__fd >> 8;
    iVar3 = bind((this_00._M_head_impl)->sd,(sockaddr *)&(this_00._M_head_impl)->addr,0x10);
    if (iVar3 == -1) {
      perror("Bind failed");
      pcVar6 = "Error: bind failed";
      sStack_40 = 0x12;
    }
    else {
      iVar3 = ::listen(*sock,in_ECX);
      if (iVar3 != -1) {
        anon_unknown.dwarf_7a85::setNonBlocking(sock);
        (this_00._M_head_impl)->isServer = true;
        (this_00._M_head_impl)->isListening = true;
        iVar4 = 0;
        if (0 < __n) {
          iVar4 = __n;
        }
        (this_00._M_head_impl)->timeoutListen_ms = iVar4;
        if (__n < 1) {
          iVar3 = (int)CONCAT71((uint7)(uint3)((uint)__n >> 8),1);
          if (-1 < __n) goto LAB_0010e74f;
          (this_00._M_head_impl)->timeoutListen_ms = 1;
          do {
            if ((this_00._M_head_impl)->isListening != true) goto LAB_0010e74d;
            bVar2 = Data::doListen(this_00._M_head_impl);
          } while (!bVar2);
        }
        else {
          bVar2 = Data::doListen(this_00._M_head_impl);
          iVar3 = (int)CONCAT71(extraout_var,bVar2);
        }
        (this_00._M_head_impl)->isListening = false;
        goto LAB_0010e74f;
      }
      pcVar6 = "Error: listen failed";
      sStack_40 = 0x14;
    }
    fwrite(pcVar6,sStack_40,1,_stderr);
  }
LAB_0010e74d:
  iVar3 = 0;
LAB_0010e74f:
  pthread_mutex_unlock((pthread_mutex_t *)&(this_00._M_head_impl)->mutex);
  return iVar3;
}

Assistant:

bool Communicator::listen(TPort port, int32_t timeout_ms, int32_t maxConnections) {
        auto & data = getData();

        std::lock_guard<std::mutex> lock(data.mutex);

        if (data.isConnected) return false;
        if (data.isListening) return false;

        ::closeAndReset(data.sd);

        data.sd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
        if (data.sd < 0) {
            ::closeAndReset(data.sd);
            fprintf(stderr, "Error creating socket (%d %s)\n", errno, strerror(errno));
            return false;
        }

        int enable = 1;
        if (setsockopt(data.sd, SOL_SOCKET, SO_REUSEADDR, (char *)&enable, sizeof(int)) < 0) {
            fprintf(stderr, "setsockopt(SO_REUSEADDR) failed");
        }

#ifndef _WIN32
        if (setsockopt(data.sd, SOL_SOCKET, SO_REUSEPORT, (char *)&enable, sizeof(int)) < 0) {
            fprintf(stderr, "setsockopt(SO_REUSEPORT) failed");
        }
#endif

        //{
        //    linger lin;
        //    lin.l_onoff = 0;
        //    lin.l_linger = 0;
        //    if (setsockopt(data.sd, SOL_SOCKET, SO_LINGER, (const char *)&lin, sizeof(lin)) < 0) {
        //        fprintf(stderr, "setsockopt(SO_LINGER) failed");
        //    }
        //}

        auto & addr = data.addr;

        memset(&addr, 0, sizeof(addr));
        addr.sin_family = AF_INET;
        addr.sin_addr.s_addr = INADDR_ANY;
        addr.sin_port = htons(port);

        int res = bind(data.sd, (struct sockaddr *)&addr, sizeof(addr));
        if (res == -1) {
            perror("Bind failed");
            fprintf(stderr, "Error: bind failed");
            return false;
        }

        res = ::listen(data.sd, maxConnections);
        if (res == -1) {
            fprintf(stderr, "Error: listen failed");
            return false;
        }

        ::setNonBlocking(data.sd);

        data.isServer = true;
        data.isListening = true;

        data.timeoutListen_ms = (std::max)(0, timeout_ms);
        if (timeout_ms > 0) {
            bool success = data.doListen();

            data.isListening = false;
            return success;
        } else if (timeout_ms < 0) {
            data.timeoutListen_ms = 1;
            while (data.isListening) {
                bool success = data.doListen();
                if (success) {
                    data.isListening = false;
                    return true;
                }
            }
            return false;
        }

        return true;
    }